

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  CURLcode CVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char *local_c0;
  char *nl;
  char s;
  _Bool endquote;
  size_t sStack_b0;
  _Bool escape;
  size_t len;
  char *pcStack_a0;
  _Bool quoted;
  char *tok_end;
  char *tok;
  dynbuf *filebuf;
  dynbuf token;
  char *netrcbuffer;
  _Bool done;
  int iStack_58;
  _Bool our_login;
  found_state found;
  host_lookup_state state;
  _Bool password_alloc;
  _Bool login_alloc;
  _Bool specific_login;
  char *password;
  char *login;
  int retcode;
  char *netrcfile_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  store_netrc *store_local;
  
  login._4_4_ = 1;
  password = *loginp;
  _state = *passwordp;
  bVar6 = false;
  if (password != (char *)0x0) {
    bVar6 = *password != '\0';
  }
  bVar2 = false;
  bVar3 = false;
  iStack_58 = 0;
  netrcbuffer._4_4_ = 0;
  bVar8 = true;
  bVar1 = false;
  tok = (char *)store;
  Curl_dyn_init((dynbuf *)&filebuf,0x80);
  if ((store->field_0x28 & 1) == 0) {
    CVar4 = file2memory(netrcfile,(dynbuf *)tok);
    if (CVar4 != CURLE_OK) {
      return -1;
    }
    store->field_0x28 = store->field_0x28 & 0xfe | 1;
  }
  token.toobig = (size_t)Curl_dyn_ptr((dynbuf *)tok);
  while (!bVar1) {
    tok_end = (char *)token.toobig;
    while (tok_end != (char *)0x0) {
      Curl_dyn_reset((dynbuf *)&filebuf);
      while( true ) {
        bVar7 = true;
        if (*tok_end != ' ') {
          bVar7 = *tok_end == '\t';
        }
        if (!bVar7) break;
        tok_end = tok_end + 1;
      }
      if ((iStack_58 == 3) && ((*tok_end == '\n' || (*tok_end == '\r')))) {
        iStack_58 = 0;
      }
      if ((*tok_end == '\0') || (*tok_end == '\n')) break;
      len._7_1_ = *tok_end == '\"';
      pcStack_a0 = tok_end;
      if ((bool)len._7_1_) {
        nl._7_1_ = 0;
        nl._6_1_ = 0;
        pcStack_a0 = tok_end + 1;
        while (*pcStack_a0 != '\0') {
          nl._5_1_ = *pcStack_a0;
          if ((nl._7_1_ & 1) == 0) {
            if (nl._5_1_ != '\\') {
              if (nl._5_1_ != '\"') goto LAB_0016f29c;
              pcStack_a0 = pcStack_a0 + 1;
              nl._6_1_ = 1;
              break;
            }
            nl._7_1_ = 1;
            pcStack_a0 = pcStack_a0 + 1;
          }
          else {
            nl._7_1_ = 0;
            if (nl._5_1_ == 'n') {
              nl._5_1_ = '\n';
            }
            else if (nl._5_1_ == 'r') {
              nl._5_1_ = '\r';
            }
            else if (nl._5_1_ == 't') {
              nl._5_1_ = '\t';
            }
LAB_0016f29c:
            CVar4 = Curl_dyn_addn((dynbuf *)&filebuf,(void *)((long)&nl + 5),1);
            if (CVar4 != CURLE_OK) {
              login._4_4_ = -1;
              goto LAB_0016f61a;
            }
            pcStack_a0 = pcStack_a0 + 1;
          }
        }
        if (((nl._7_1_ & 1) != 0) || ((nl._6_1_ & 1) == 0)) {
          login._4_4_ = -1;
          goto LAB_0016f61a;
        }
      }
      else {
        sStack_b0 = 0;
        while( true ) {
          bVar7 = true;
          if (((*pcStack_a0 != ' ') && (bVar7 = true, *pcStack_a0 != '\t')) &&
             (bVar7 = false, '\t' < *pcStack_a0)) {
            bVar7 = *pcStack_a0 < '\x0e';
          }
          if (bVar7) break;
          pcStack_a0 = pcStack_a0 + 1;
          sStack_b0 = sStack_b0 + 1;
        }
        if ((sStack_b0 == 0) ||
           (CVar4 = Curl_dyn_addn((dynbuf *)&filebuf,tok_end,sStack_b0), CVar4 != CURLE_OK)) {
          login._4_4_ = -1;
          goto LAB_0016f61a;
        }
      }
      if ((((password != (char *)0x0) && (*password != '\0')) && (_state != (char *)0x0)) &&
         (*_state != '\0')) {
        bVar1 = true;
        break;
      }
      tok_end = Curl_dyn_ptr((dynbuf *)&filebuf);
      switch(iStack_58) {
      case 0:
        iVar5 = curl_strequal("macdef",tok_end);
        if (iVar5 == 0) {
          iVar5 = curl_strequal("machine",tok_end);
          if (iVar5 == 0) {
            iVar5 = curl_strequal("default",tok_end);
            if (iVar5 != 0) {
              iStack_58 = 2;
              login._4_4_ = 0;
            }
          }
          else {
            iStack_58 = 1;
          }
        }
        else {
          iStack_58 = 3;
        }
        break;
      case 1:
        iVar5 = curl_strequal(host,tok_end);
        if (iVar5 == 0) {
          iStack_58 = 0;
        }
        else {
          iStack_58 = 2;
          login._4_4_ = 0;
        }
        break;
      case 2:
        if (netrcbuffer._4_4_ == 1) {
          if (bVar6) {
            iVar5 = Curl_timestrcmp(password,tok_end);
            bVar8 = iVar5 == 0;
          }
          else if ((password == (char *)0x0) ||
                  (iVar5 = Curl_timestrcmp(password,tok_end), iVar5 != 0)) {
            if (bVar2) {
              (*Curl_cfree)(password);
            }
            password = (*Curl_cstrdup)(tok_end);
            if (password == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_0016f61a;
            }
            bVar2 = true;
          }
          netrcbuffer._4_4_ = 0;
        }
        else if (netrcbuffer._4_4_ == 2) {
          if (((bVar8) || (!bVar6)) &&
             ((_state == (char *)0x0 || (iVar5 = Curl_timestrcmp(_state,tok_end), iVar5 != 0)))) {
            if (bVar3) {
              (*Curl_cfree)(_state);
            }
            _state = (*Curl_cstrdup)(tok_end);
            if (_state == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_0016f61a;
            }
            bVar3 = true;
          }
          netrcbuffer._4_4_ = 0;
        }
        else {
          iVar5 = curl_strequal("login",tok_end);
          if (iVar5 == 0) {
            iVar5 = curl_strequal("password",tok_end);
            if (iVar5 == 0) {
              iVar5 = curl_strequal("machine",tok_end);
              if (iVar5 != 0) {
                iStack_58 = 1;
                netrcbuffer._4_4_ = 0;
              }
            }
            else {
              netrcbuffer._4_4_ = 2;
            }
          }
          else {
            netrcbuffer._4_4_ = 1;
          }
        }
        break;
      case 3:
        if (*tok_end == '\0') {
          iStack_58 = 0;
        }
      }
      pcStack_a0 = pcStack_a0 + 1;
      tok_end = pcStack_a0;
    }
    if (!bVar1) {
      local_c0 = (char *)0x0;
      if (tok_end != (char *)0x0) {
        local_c0 = strchr(tok_end,10);
      }
      if (local_c0 == (char *)0x0) break;
      token.toobig = (size_t)(local_c0 + 1);
    }
  }
LAB_0016f61a:
  Curl_dyn_free((dynbuf *)&filebuf);
  if (login._4_4_ == 0) {
    if (bVar2) {
      (*Curl_cfree)(*loginp);
      *loginp = password;
    }
    if (bVar3) {
      (*Curl_cfree)(*passwordp);
      *passwordp = _state;
    }
  }
  else {
    Curl_dyn_free((dynbuf *)tok);
    if (bVar2) {
      (*Curl_cfree)(password);
    }
    if (bVar3) {
      (*Curl_cfree)(_state);
    }
  }
  return login._4_4_;
}

Assistant:

static int parsenetrc(struct store_netrc *store,
                      const char *host,
                      char **loginp,
                      char **passwordp,
                      const char *netrcfile)
{
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;
  enum found_state found = NONE;
  bool our_login = TRUE;  /* With specific_login, found *our* login name (or
                             login-less line) */
  bool done = FALSE;
  char *netrcbuffer;
  struct dynbuf token;
  struct dynbuf *filebuf = &store->filebuf;
  Curl_dyn_init(&token, MAX_NETRC_TOKEN);

  if(!store->loaded) {
    if(file2memory(netrcfile, filebuf))
      return NETRC_FAILED;
    store->loaded = TRUE;
  }

  netrcbuffer = Curl_dyn_ptr(filebuf);

  while(!done) {
    char *tok = netrcbuffer;
    while(tok) {
      char *tok_end;
      bool quoted;
      Curl_dyn_reset(&token);
      while(ISBLANK(*tok))
        tok++;
      /* tok is first non-space letter */
      if(state == MACDEF) {
        if((*tok == '\n') || (*tok == '\r'))
          state = NOTHING; /* end of macro definition */
      }

      if(!*tok || (*tok == '\n'))
        /* end of line  */
        break;

      /* leading double-quote means quoted string */
      quoted = (*tok == '\"');

      tok_end = tok;
      if(!quoted) {
        size_t len = 0;
        while(!ISSPACE(*tok_end)) {
          tok_end++;
          len++;
        }
        if(!len || Curl_dyn_addn(&token, tok, len)) {
          retcode = NETRC_FAILED;
          goto out;
        }
      }
      else {
        bool escape = FALSE;
        bool endquote = FALSE;
        tok_end++; /* pass the leading quote */
        while(*tok_end) {
          char s = *tok_end;
          if(escape) {
            escape = FALSE;
            switch(s) {
            case 'n':
              s = '\n';
              break;
            case 'r':
              s = '\r';
              break;
            case 't':
              s = '\t';
              break;
            }
          }
          else if(s == '\\') {
            escape = TRUE;
            tok_end++;
            continue;
          }
          else if(s == '\"') {
            tok_end++; /* pass the ending quote */
            endquote = TRUE;
            break;
          }
          if(Curl_dyn_addn(&token, &s, 1)) {
            retcode = NETRC_FAILED;
            goto out;
          }
          tok_end++;
        }
        if(escape || !endquote) {
          /* bad syntax, get out */
          retcode = NETRC_FAILED;
          goto out;
        }
      }

      if((login && *login) && (password && *password)) {
        done = TRUE;
        break;
      }

      tok = Curl_dyn_ptr(&token);

      switch(state) {
      case NOTHING:
        if(strcasecompare("macdef", tok))
          /* Define a macro. A macro is defined with the specified name; its
             contents begin with the next .netrc line and continue until a
             null line (consecutive new-line characters) is encountered. */
          state = MACDEF;
        else if(strcasecompare("machine", tok))
          /* the next tok is the machine name, this is in itself the delimiter
             that starts the stuff entered for this machine, after this we
             need to search for 'login' and 'password'. */
          state = HOSTFOUND;
        else if(strcasecompare("default", tok)) {
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        break;
      case MACDEF:
        if(!*tok)
          state = NOTHING;
        break;
      case HOSTFOUND:
        if(strcasecompare(host, tok)) {
          /* and yes, this is our host! */
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        else
          /* not our host */
          state = NOTHING;
        break;
      case HOSTVALID:
        /* we are now parsing sub-keywords concerning "our" host */
        if(found == LOGIN) {
          if(specific_login) {
            our_login = !Curl_timestrcmp(login, tok);
          }
          else if(!login || Curl_timestrcmp(login, tok)) {
            if(login_alloc)
              free(login);
            login = strdup(tok);
            if(!login) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            login_alloc = TRUE;
          }
          found = NONE;
        }
        else if(found == PASSWORD) {
          if((our_login || !specific_login) &&
             (!password || Curl_timestrcmp(password, tok))) {
            if(password_alloc)
              free(password);
            password = strdup(tok);
            if(!password) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            password_alloc = TRUE;
          }
          found = NONE;
        }
        else if(strcasecompare("login", tok))
          found = LOGIN;
        else if(strcasecompare("password", tok))
          found = PASSWORD;
        else if(strcasecompare("machine", tok)) {
          /* ok, there is machine here go => */
          state = HOSTFOUND;
          found = NONE;
        }
        break;
      } /* switch (state) */
      tok = ++tok_end;
    }
    if(!done) {
      char *nl = NULL;
      if(tok)
        nl = strchr(tok, '\n');
      if(!nl)
        break;
      /* point to next line */
      netrcbuffer = &nl[1];
    }
  } /* while !done */

out:
  Curl_dyn_free(&token);
  if(!retcode) {
    /* success */
    if(login_alloc) {
      free(*loginp);
      *loginp = login;
    }
    if(password_alloc) {
      free(*passwordp);
      *passwordp = password;
    }
  }
  else {
    Curl_dyn_free(filebuf);
    if(login_alloc)
      free(login);
    if(password_alloc)
      free(password);
  }

  return retcode;
}